

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_stop_in_cb(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_b_2;
  char path [24];
  uv_timer_t timer;
  uv_fs_event_t fs;
  char local_108 [24];
  char *local_f0 [15];
  undefined1 local_78 [104];
  
  builtin_strncpy(local_108,"fs_event_stop_in_cb.txt",0x18);
  remove(local_108);
  create_file(local_108);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_event_init(uVar2,local_78);
  local_f0[0] = (char *)(long)iVar1;
  if (local_f0[0] == (char *)0x0) {
    iVar1 = uv_fs_event_start(local_78,fs_event_cb_stop,local_108,0);
    local_f0[0] = (char *)(long)iVar1;
    if (local_f0[0] != (char *)0x0) goto LAB_0018a14e;
    local_f0[0] = local_108;
    uVar2 = uv_default_loop();
    iVar1 = uv_timer_init(uVar2,local_f0);
    if (iVar1 != 0) goto LAB_0018a15b;
    iVar1 = uv_timer_start(local_f0,timer_cb_touch,100,0);
    if (iVar1 != 0) goto LAB_0018a168;
    if (fs_event_cb_stop_calls != 0) goto LAB_0018a175;
    if (timer_cb_touch_called != 0) goto LAB_0018a182;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0018a18f;
    if (fs_event_cb_stop_calls != 1) goto LAB_0018a19c;
    if (timer_cb_touch_called != 1) goto LAB_0018a1a9;
    uv_close(local_78,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0018a1b6;
    if (fs_event_cb_stop_calls == 1) {
      remove(local_108);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018a1d0;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_0018a14e:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_0018a15b:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_0018a168:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_0018a175:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_0018a182:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_0018a18f:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_0018a19c:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_0018a1a9:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_0018a1b6:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_0018a1d0:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop();
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_event_stop_in_cb) {
  uv_fs_event_t fs;
  uv_timer_t timer;
  char path[] = "fs_event_stop_in_cb.txt";

#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  remove(path);
  create_file(path);

  ASSERT_OK(uv_fs_event_init(uv_default_loop(), &fs));
  ASSERT_OK(uv_fs_event_start(&fs, fs_event_cb_stop, path, 0));

  /* Note: timer_cb_touch() closes the handle. */
  timer.data = path;
  ASSERT_OK(uv_timer_init(uv_default_loop(), &timer));
  ASSERT_OK(uv_timer_start(&timer, timer_cb_touch, 100, 0));

  ASSERT_OK(fs_event_cb_stop_calls);
  ASSERT_OK(timer_cb_touch_called);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, fs_event_cb_stop_calls);
  ASSERT_EQ(1, timer_cb_touch_called);

  uv_close((uv_handle_t*) &fs, NULL);
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, fs_event_cb_stop_calls);

  remove(path);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}